

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

interval_t __thiscall
duckdb::Interpolator<false>::
Operation<unsigned_long,duckdb::interval_t,duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t>,duckdb::QuantileIndirect<duckdb::timestamp_t>>>
          (Interpolator<false> *this,unsigned_long *v_t,Vector *result,
          QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>,_duckdb::QuantileIndirect<duckdb::timestamp_t>_>
          *accessor)

{
  DataChunk *pDVar1;
  idx_t iVar2;
  idx_t iVar3;
  idx_t iVar4;
  CURSOR *pCVar5;
  long lVar6;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>,_duckdb::QuantileIndirect<duckdb::timestamp_t>_>_>_>
  __comp;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>,_duckdb::QuantileIndirect<duckdb::timestamp_t>_>_>_>
  __comp_00;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>,_duckdb::QuantileIndirect<duckdb::timestamp_t>_>_>_>
  __comp_01;
  bool bVar7;
  ulong uVar8;
  reference pvVar9;
  InvalidInputException *pIVar10;
  int64_t iVar11;
  MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t> *pMVar12;
  RESULT_TYPE RVar13;
  interval_t iVar14;
  interval_t input;
  interval_t input_00;
  interval_t input_01;
  interval_t result_1;
  string local_88;
  pointer local_68;
  size_type sStack_60;
  MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t> *local_50;
  pointer local_48;
  size_type sStack_40;
  
  bVar7 = this->desc;
  iVar2 = this->FRN;
  iVar3 = this->begin;
  iVar4 = this->end;
  local_88._M_dataplus._M_p = (pointer)accessor;
  local_88._M_string_length = (size_type)accessor;
  local_88.field_2._M_local_buf[0] = bVar7;
  if (this->CRN == iVar2) {
    if (iVar2 != iVar4 && iVar3 != iVar4) {
      uVar8 = (long)(iVar4 * 8 + iVar3 * -8) >> 3;
      lVar6 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      __comp._M_comp._17_7_ = local_88.field_2._M_allocated_capacity._1_7_;
      __comp._M_comp.desc = bVar7;
      __comp._M_comp.accessor_r = accessor;
      __comp._M_comp.accessor_l = accessor;
      ::std::
      __introselect<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t>,duckdb::QuantileIndirect<duckdb::timestamp_t>>>>>
                (v_t + iVar3,v_t + iVar2,v_t + iVar4,(ulong)(((uint)lVar6 ^ 0x3f) * 2) ^ 0x7e,__comp
                );
    }
    pMVar12 = accessor->outer;
    pCVar5 = accessor->inner->data;
    uVar8 = v_t[this->FRN];
    if (((pCVar5->scan).next_row_index <= uVar8) || (uVar8 < (pCVar5->scan).current_row_index)) {
      pDVar1 = &pCVar5->page;
      ColumnDataCollection::Seek(pCVar5->inputs,uVar8,&pCVar5->scan,pDVar1);
      pvVar9 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar5->data = (timestamp_t *)pvVar9->data;
      pvVar9 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar9);
      pCVar5->validity = &pvVar9->validity;
    }
    local_88._M_dataplus._M_p =
         (pointer)pCVar5->data[(uint)((int)uVar8 - (int)(pCVar5->scan).current_row_index)].value;
    RVar13 = MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>::operator()
                       (pMVar12,(INPUT_TYPE *)&local_88);
    input._0_8_ = RVar13.micros;
    iVar11 = 0;
    bVar7 = TryCast::Operation<duckdb::interval_t,duckdb::interval_t>
                      (RVar13,(interval_t *)&local_68,false);
    if (!bVar7) {
      pIVar10 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input.micros = iVar11;
      CastExceptionText<duckdb::interval_t,duckdb::interval_t>(&local_88,RVar13._0_8_,input);
      InvalidInputException::InvalidInputException(pIVar10,(string *)&local_88);
      __cxa_throw(pIVar10,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    iVar14.micros = sStack_60;
    iVar14._0_8_ = local_68;
  }
  else {
    if (iVar2 != iVar4 && iVar3 != iVar4) {
      uVar8 = (long)(iVar4 * 8 + iVar3 * -8) >> 3;
      lVar6 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      __comp_00._M_comp._17_7_ = local_88.field_2._M_allocated_capacity._1_7_;
      __comp_00._M_comp.desc = bVar7;
      __comp_00._M_comp.accessor_r = accessor;
      __comp_00._M_comp.accessor_l = accessor;
      ::std::
      __introselect<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t>,duckdb::QuantileIndirect<duckdb::timestamp_t>>>>>
                (v_t + iVar3,v_t + iVar2,v_t + iVar4,(ulong)(((uint)lVar6 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_00);
    }
    iVar2 = this->FRN;
    iVar3 = this->end;
    local_88._M_dataplus._M_p = (pointer)accessor;
    local_88._M_string_length = (size_type)accessor;
    local_88.field_2._M_local_buf[0] = bVar7;
    if (this->CRN != iVar3 && iVar2 != iVar3) {
      uVar8 = (long)(iVar3 * 8 + iVar2 * -8) >> 3;
      lVar6 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      __comp_01._M_comp._17_7_ = local_88.field_2._M_allocated_capacity._1_7_;
      __comp_01._M_comp.desc = bVar7;
      __comp_01._M_comp.accessor_r = accessor;
      __comp_01._M_comp.accessor_l = accessor;
      ::std::
      __introselect<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t>,duckdb::QuantileIndirect<duckdb::timestamp_t>>>>>
                (v_t + iVar2,v_t + this->CRN,v_t + iVar3,(ulong)(((uint)lVar6 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_01);
    }
    pCVar5 = accessor->inner->data;
    uVar8 = v_t[this->FRN];
    if (((pCVar5->scan).next_row_index <= uVar8) ||
       (pMVar12 = accessor->outer, uVar8 < (pCVar5->scan).current_row_index)) {
      pDVar1 = &pCVar5->page;
      local_50 = accessor->outer;
      ColumnDataCollection::Seek(pCVar5->inputs,uVar8,&pCVar5->scan,pDVar1);
      pvVar9 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar5->data = (timestamp_t *)pvVar9->data;
      pvVar9 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar9);
      pCVar5->validity = &pvVar9->validity;
      pMVar12 = local_50;
    }
    local_88._M_dataplus._M_p =
         (pointer)pCVar5->data[(uint)((int)uVar8 - (int)(pCVar5->scan).current_row_index)].value;
    RVar13 = MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>::operator()
                       (pMVar12,(INPUT_TYPE *)&local_88);
    input_00._0_8_ = RVar13.micros;
    iVar11 = 0;
    bVar7 = TryCast::Operation<duckdb::interval_t,duckdb::interval_t>
                      (RVar13,(interval_t *)&local_68,false);
    if (!bVar7) {
      pIVar10 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_00.micros = iVar11;
      CastExceptionText<duckdb::interval_t,duckdb::interval_t>(&local_88,RVar13._0_8_,input_00);
      InvalidInputException::InvalidInputException(pIVar10,(string *)&local_88);
      __cxa_throw(pIVar10,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_48 = local_68;
    sStack_40 = sStack_60;
    pMVar12 = accessor->outer;
    pCVar5 = accessor->inner->data;
    uVar8 = v_t[this->CRN];
    if (((pCVar5->scan).next_row_index <= uVar8) || (uVar8 < (pCVar5->scan).current_row_index)) {
      pDVar1 = &pCVar5->page;
      ColumnDataCollection::Seek(pCVar5->inputs,uVar8,&pCVar5->scan,pDVar1);
      pvVar9 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar5->data = (timestamp_t *)pvVar9->data;
      pvVar9 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar9);
      pCVar5->validity = &pvVar9->validity;
    }
    local_88._M_dataplus._M_p =
         (pointer)pCVar5->data[(uint)((int)uVar8 - (int)(pCVar5->scan).current_row_index)].value;
    RVar13 = MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>::operator()
                       (pMVar12,(INPUT_TYPE *)&local_88);
    input_01._0_8_ = RVar13.micros;
    iVar11 = 0;
    bVar7 = TryCast::Operation<duckdb::interval_t,duckdb::interval_t>
                      (RVar13,(interval_t *)&local_68,false);
    if (!bVar7) {
      pIVar10 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_01.micros = iVar11;
      CastExceptionText<duckdb::interval_t,duckdb::interval_t>(&local_88,RVar13._0_8_,input_01);
      InvalidInputException::InvalidInputException(pIVar10,(string *)&local_88);
      __cxa_throw(pIVar10,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_88._M_dataplus._M_p = local_68;
    local_88._M_string_length = sStack_60;
    iVar14 = CastInterpolation::Interpolate<duckdb::interval_t>
                       ((interval_t *)&local_48,
                        this->RN -
                        (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) -
                         1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0)),
                        (interval_t *)&local_88);
  }
  return iVar14;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		if (CRN == FRN) {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
		} else {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			std::nth_element(v_t + FRN, v_t + CRN, v_t + end, comp);
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[CRN]), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}